

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Mat4x3 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,12>
          (Mat4x3 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  undefined1 local_60 [12];
  undefined1 local_54 [12];
  Vector<float,_4> local_48;
  Vector<float,_4> local_2c;
  undefined4 local_1c;
  MatrixCaseUtils *pMStack_18;
  int inputNdx_local;
  ShaderEvalContext *evalCtx_local;
  Mat4x3 *m;
  
  local_1c = SUB84(evalCtx,0);
  local_2c.m_data[3]._3_1_ = 0;
  pMStack_18 = this;
  evalCtx_local = (ShaderEvalContext *)__return_storage_ptr__;
  tcu::Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  tcu::Vector<float,_4>::swizzle(&local_2c,(int)pMStack_18 + 0x30,0,1);
  tcu::Matrix<float,_3,_4>::setColumn(__return_storage_ptr__,0,(Vector<float,_3> *)&local_2c);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(local_54 + 0xc),(int)pMStack_18 + 0x40,0,1);
  tcu::Matrix<float,_3,_4>::setColumn(__return_storage_ptr__,1,(Vector<float,_3> *)(local_54 + 0xc))
  ;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_54,(int)pMStack_18 + 0x50,0,1);
  tcu::Matrix<float,_3,_4>::setColumn(__return_storage_ptr__,2,(Vector<float,_3> *)local_54);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_60,(int)pMStack_18 + 0x60,0,1);
  tcu::Matrix<float,_3,_4>::setColumn(__return_storage_ptr__,3,(Vector<float,_3> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat4x3 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4X3> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4x3 m;
	m.setColumn(0, evalCtx.in[0].swizzle(0,1,2));
	m.setColumn(1, evalCtx.in[1].swizzle(0,1,2));
	m.setColumn(2, evalCtx.in[2].swizzle(0,1,2));
	m.setColumn(3, evalCtx.in[3].swizzle(0,1,2));
	return m;
}